

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall
FlowGraph::RemoveBlock(FlowGraph *this,BasicBlock *block,GlobOpt *globOpt,bool tailDuping)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *this_00;
  BasicBlock *pBVar1;
  Instr *pIVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  Loop *pLVar4;
  code *pcVar5;
  GlobOpt *pGVar6;
  Loop **ppLVar7;
  bool bVar8;
  ushort uVar9;
  undefined4 *puVar10;
  LabelInstr *pLVar11;
  Type *ppFVar12;
  Loop **ppLVar13;
  ushort uVar14;
  long lVar15;
  Func **ppFVar16;
  GlobOpt *pGVar17;
  Instr *this_01;
  Instr *local_58;
  Iterator local_48;
  GlobOpt *local_38;
  
  local_38 = globOpt;
  if ((block->field_0x18 & 3) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd34,"(!block->isDead && !block->isDeleted)",
                       "!block->isDead && !block->isDeleted");
    if (!bVar8) {
LAB_003f5312:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
  }
  pBVar1 = block->next;
  ppFVar16 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar16 = &block->func;
  }
  lVar15 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar15 = 0xd0;
  }
  lVar15 = *(long *)((long)&(*ppFVar16)->m_alloc + lVar15);
  if (lVar15 == 0) {
    local_58 = (Instr *)0x0;
  }
  else {
    local_58 = *(Instr **)(lVar15 + 0x10);
  }
  this_01 = block->firstInstr;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pGVar17 = local_38;
  while ((pGVar6 = local_38, this_01 != local_58 && (this_01->m_opcode != FunctionExit))) {
    pIVar2 = this_01->m_next;
    if (this_01 == block->firstInstr) {
      if ((this_01->m_kind != InstrKindLabel) && (this_01->m_kind != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xd41,"(instr->IsLabelInstr())","instr->IsLabelInstr()");
        if (!bVar8) goto LAB_003f5312;
        *puVar10 = 0;
      }
      pLVar11 = IR::Instr::AsLabelInstr(this_01);
      pLVar11->field_0x78 = pLVar11->field_0x78 & 0xfe;
      pLVar11 = IR::Instr::AsLabelInstr(this_01);
      pLVar11->field_0x78 = pLVar11->field_0x78 & 0xfb;
      pGVar17 = local_38;
      this_01 = pIVar2;
    }
    else {
      RemoveInstr(this,this_01,local_38);
      pGVar17 = pGVar6;
      this_01 = pIVar2;
    }
  }
  local_48.list = &(block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_48.current = &(local_48.list)->super_SListNodeBase<Memory::ArenaAllocator>;
  local_38 = (GlobOpt *)local_48.list;
  while( true ) {
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_003f5312;
      *puVar10 = 0;
    }
    local_48.current =
         (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
          &((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current)->
           super_SListNodeBase<Memory::ArenaAllocator>)->super_SListNodeBase<Memory::ArenaAllocator>
         ).next;
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
        local_48.list) break;
    ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
    BasicBlock::RemoveSucc((*ppFVar12)->predBlock,block,this,false,pGVar17 != (GlobOpt *)0x0);
  }
  this_00 = &block->succList;
  local_48.list = &this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_48.current = (NodeBase *)this_00;
  do {
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_003f5312;
      *puVar10 = 0;
    }
    pSVar3 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&(local_48.current)->next
              )->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (pSVar3 == local_48.list) {
      uVar9 = *(ushort *)&block->field_0x18;
      if (((uVar9 & 4) != 0) && (this->loopList != (Loop *)0x0)) {
        ppLVar7 = &this->loopList;
        do {
          ppLVar13 = ppLVar7;
          pLVar4 = *ppLVar13;
          ppLVar7 = &pLVar4->next;
        } while (pLVar4 != block->loop);
        *ppLVar13 = *ppLVar7;
        this->hasLoop = this->loopList != (Loop *)0x0;
        uVar9 = *(ushort *)&block->field_0x18;
      }
      if (pGVar17 != (GlobOpt *)0x0) {
        *(ushort *)&block->field_0x18 = uVar9 | 2;
        SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::MoveTo
                  ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_38,
                   &(block->deadPredList).
                    super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
        SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::MoveTo
                  (&this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>,
                   &(block->deadSuccList).
                    super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
        uVar9 = *(ushort *)&block->field_0x18;
      }
      uVar14 = uVar9 | 2;
      if (!tailDuping) {
        uVar14 = uVar9;
      }
      *(ushort *)&block->field_0x18 = uVar14 | 1;
      block->dataUseCount = 0;
      return;
    }
    local_48.current = (NodeBase *)pSVar3;
    ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
    BasicBlock::RemovePred((*ppFVar12)->succBlock,block,this,false,pGVar17 != (GlobOpt *)0x0);
  } while( true );
}

Assistant:

void
FlowGraph::RemoveBlock(BasicBlock *block, GlobOpt * globOpt, bool tailDuping)
{
    Assert(!block->isDead && !block->isDeleted);
    IR::Instr * lastInstr = nullptr;
    FOREACH_INSTR_IN_BLOCK_EDITING(instr, instrNext, block)
    {
        if (instr->m_opcode == Js::OpCode::FunctionExit)
        {
            // Removing FunctionExit causes problems downstream...
            // We could change the opcode, or have FunctionEpilog/FunctionExit to get
            // rid of the epilog.
            break;
        }
        if (instr == block->GetFirstInstr())
        {
            Assert(instr->IsLabelInstr());
            instr->AsLabelInstr()->m_isLoopTop = false;
            instr->AsLabelInstr()->m_hasNonBranchRef = false;
        }
        else
        {
            lastInstr = this->RemoveInstr(instr, globOpt);
        }
    } NEXT_INSTR_IN_BLOCK_EDITING;

    if (lastInstr)
    {
        block->SetLastInstr(lastInstr);
    }
    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, block->GetPredList())
    {
        edge->GetPred()->RemoveSucc(block, this, false, globOpt != nullptr);
    } NEXT_SLISTBASECOUNTED_ENTRY;

    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, block->GetSuccList())
    {
        edge->GetSucc()->RemovePred(block, this, false, globOpt != nullptr);
    } NEXT_SLISTBASECOUNTED_ENTRY;

    if (block->isLoopHeader && this->loopList)
    {
        // If loop graph is built, remove loop from loopList
        Loop **pPrevLoop = &this->loopList;

        while (*pPrevLoop != block->loop)
        {
            pPrevLoop = &((*pPrevLoop)->next);
        }
        *pPrevLoop = (*pPrevLoop)->next;
        this->hasLoop = (this->loopList != nullptr);
    }
    if (globOpt != nullptr)
    {
        block->isDead = true;
        block->GetPredList()->MoveTo(block->GetDeadPredList());
        block->GetSuccList()->MoveTo(block->GetDeadSuccList());
    }
    if (tailDuping)
    {
        block->isDead = true;
    }
    block->isDeleted = true;
    block->SetDataUseCount(0);
}